

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O3

btWheelInfo * __thiscall
btRaycastVehicle::addWheel
          (btRaycastVehicle *this,btVector3 *connectionPointCS,btVector3 *wheelDirectionCS0,
          btVector3 *wheelAxleCS,btScalar suspensionRestLength,btScalar wheelRadius,
          btVehicleTuning *tuning,bool isFrontWheel)

{
  btScalar *pbVar1;
  btScalar bVar2;
  btScalar bVar3;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  btScalar bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  btWheelInfo *pbVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  int iVar21;
  btWheelInfo *pbVar22;
  byte bVar23;
  btWheelInfo *local_158;
  
  bVar23 = 0;
  bVar5 = *(btScalar *)tuning;
  bVar6 = *(btScalar *)(tuning + 4);
  bVar7 = *(btScalar *)(tuning + 8);
  bVar2 = *(btScalar *)(tuning + 0x10);
  bVar3 = *(btScalar *)(tuning + 0xc);
  bVar4 = *(btScalar *)(tuning + 0x14);
  uVar8 = *(undefined8 *)connectionPointCS->m_floats;
  uVar9 = *(undefined8 *)(connectionPointCS->m_floats + 2);
  uVar10 = *(undefined8 *)wheelDirectionCS0->m_floats;
  uVar11 = *(undefined8 *)(wheelDirectionCS0->m_floats + 2);
  uVar12 = *(undefined8 *)wheelAxleCS->m_floats;
  uVar13 = *(undefined8 *)(wheelAxleCS->m_floats + 2);
  uVar16 = (this->m_wheelInfo).m_size;
  if (uVar16 == (this->m_wheelInfo).m_capacity) {
    iVar21 = 1;
    if (uVar16 != 0) {
      iVar21 = uVar16 * 2;
    }
    if ((int)uVar16 < iVar21) {
      if (iVar21 == 0) {
        local_158 = (btWheelInfo *)0x0;
      }
      else {
        local_158 = (btWheelInfo *)btAlignedAllocInternal((long)iVar21 * 0x128,0x10);
        uVar16 = (this->m_wheelInfo).m_size;
      }
      if (0 < (int)uVar16) {
        lVar18 = 0;
        do {
          pbVar22 = (this->m_wheelInfo).m_data;
          puVar19 = (undefined8 *)
                    ((long)(pbVar22->m_raycastInfo).m_contactNormalWS.m_floats + lVar18);
          puVar20 = (undefined8 *)
                    ((long)(local_158->m_raycastInfo).m_contactNormalWS.m_floats + lVar18);
          for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar20 = *puVar19;
            puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
            puVar20 = puVar20 + (ulong)bVar23 * -2 + 1;
          }
          uVar14 = *(undefined8 *)
                    ((long)(pbVar22->m_worldTransform).m_basis.m_el[0].m_floats + lVar18 + 8);
          *(undefined8 *)((long)(local_158->m_worldTransform).m_basis.m_el[0].m_floats + lVar18) =
               *(undefined8 *)((long)(pbVar22->m_worldTransform).m_basis.m_el[0].m_floats + lVar18);
          *(undefined8 *)((long)(local_158->m_worldTransform).m_basis.m_el[0].m_floats + lVar18 + 8)
               = uVar14;
          uVar14 = *(undefined8 *)
                    ((long)(pbVar22->m_worldTransform).m_basis.m_el[1].m_floats + lVar18 + 8);
          *(undefined8 *)((long)(local_158->m_worldTransform).m_basis.m_el[1].m_floats + lVar18) =
               *(undefined8 *)((long)(pbVar22->m_worldTransform).m_basis.m_el[1].m_floats + lVar18);
          *(undefined8 *)((long)(local_158->m_worldTransform).m_basis.m_el[1].m_floats + lVar18 + 8)
               = uVar14;
          uVar14 = *(undefined8 *)
                    ((long)(pbVar22->m_worldTransform).m_basis.m_el[2].m_floats + lVar18 + 8);
          *(undefined8 *)((long)(local_158->m_worldTransform).m_basis.m_el[2].m_floats + lVar18) =
               *(undefined8 *)((long)(pbVar22->m_worldTransform).m_basis.m_el[2].m_floats + lVar18);
          *(undefined8 *)((long)(local_158->m_worldTransform).m_basis.m_el[2].m_floats + lVar18 + 8)
               = uVar14;
          uVar14 = *(undefined8 *)((long)(pbVar22->m_worldTransform).m_origin.m_floats + lVar18 + 8)
          ;
          *(undefined8 *)((long)(local_158->m_worldTransform).m_origin.m_floats + lVar18) =
               *(undefined8 *)((long)(pbVar22->m_worldTransform).m_origin.m_floats + lVar18);
          *(undefined8 *)((long)(local_158->m_worldTransform).m_origin.m_floats + lVar18 + 8) =
               uVar14;
          memcpy((void *)((long)(local_158->m_chassisConnectionPointCS).m_floats + lVar18),
                 (void *)((long)(pbVar22->m_chassisConnectionPointCS).m_floats + lVar18),0x88);
          lVar18 = lVar18 + 0x128;
        } while ((ulong)uVar16 * 0x128 - lVar18 != 0);
      }
      pbVar22 = (this->m_wheelInfo).m_data;
      if ((pbVar22 != (btWheelInfo *)0x0) && ((this->m_wheelInfo).m_ownsMemory == true)) {
        btAlignedFreeInternal(pbVar22);
      }
      (this->m_wheelInfo).m_ownsMemory = true;
      (this->m_wheelInfo).m_data = local_158;
      (this->m_wheelInfo).m_capacity = iVar21;
      uVar16 = (this->m_wheelInfo).m_size;
    }
  }
  pbVar22 = (this->m_wheelInfo).m_data;
  *(undefined8 *)pbVar22[(int)uVar16].m_wheelAxleCS.m_floats = uVar12;
  *(undefined8 *)(pbVar22[(int)uVar16].m_wheelAxleCS.m_floats + 2) = uVar13;
  *(undefined8 *)pbVar22[(int)uVar16].m_wheelDirectionCS.m_floats = uVar10;
  *(undefined8 *)(pbVar22[(int)uVar16].m_wheelDirectionCS.m_floats + 2) = uVar11;
  *(undefined8 *)pbVar22[(int)uVar16].m_chassisConnectionPointCS.m_floats = uVar8;
  *(undefined8 *)(pbVar22[(int)uVar16].m_chassisConnectionPointCS.m_floats + 2) = uVar9;
  pbVar22[(int)uVar16].m_suspensionRestLength1 = suspensionRestLength;
  pbVar22[(int)uVar16].m_maxSuspensionTravelCm = bVar3;
  pbVar22[(int)uVar16].m_wheelsRadius = wheelRadius;
  pbVar1 = &pbVar22[(int)uVar16].m_suspensionStiffness;
  *pbVar1 = bVar5;
  pbVar1[1] = bVar6;
  pbVar1[2] = bVar7;
  pbVar1[3] = bVar2;
  pbVar15 = pbVar22 + (int)uVar16;
  pbVar15->m_steering = 0.0;
  pbVar15->m_rotation = 0.0;
  *(undefined8 *)(&pbVar15->m_steering + 2) = 0x3dcccccd00000000;
  pbVar22[(int)uVar16].m_maxSuspensionForce = bVar4;
  pbVar22[(int)uVar16].m_engineForce = 0.0;
  pbVar22[(int)uVar16].m_brake = 0.0;
  pbVar22[(int)uVar16].m_bIsFrontWheel = isFrontWheel;
  iVar21 = (this->m_wheelInfo).m_size;
  (this->m_wheelInfo).m_size = iVar21 + 1;
  pbVar22 = (this->m_wheelInfo).m_data + iVar21;
  updateWheelTransformsWS(this,pbVar22,false);
  updateWheelTransform(this,(this->m_wheelInfo).m_size + -1,false);
  return pbVar22;
}

Assistant:

btWheelInfo&	btRaycastVehicle::addWheel( const btVector3& connectionPointCS, const btVector3& wheelDirectionCS0,const btVector3& wheelAxleCS, btScalar suspensionRestLength, btScalar wheelRadius,const btVehicleTuning& tuning, bool isFrontWheel)
{

	btWheelInfoConstructionInfo ci;

	ci.m_chassisConnectionCS = connectionPointCS;
	ci.m_wheelDirectionCS = wheelDirectionCS0;
	ci.m_wheelAxleCS = wheelAxleCS;
	ci.m_suspensionRestLength = suspensionRestLength;
	ci.m_wheelRadius = wheelRadius;
	ci.m_suspensionStiffness = tuning.m_suspensionStiffness;
	ci.m_wheelsDampingCompression = tuning.m_suspensionCompression;
	ci.m_wheelsDampingRelaxation = tuning.m_suspensionDamping;
	ci.m_frictionSlip = tuning.m_frictionSlip;
	ci.m_bIsFrontWheel = isFrontWheel;
	ci.m_maxSuspensionTravelCm = tuning.m_maxSuspensionTravelCm;
	ci.m_maxSuspensionForce = tuning.m_maxSuspensionForce;

	m_wheelInfo.push_back( btWheelInfo(ci));
	
	btWheelInfo& wheel = m_wheelInfo[getNumWheels()-1];
	
	updateWheelTransformsWS( wheel , false );
	updateWheelTransform(getNumWheels()-1,false);
	return wheel;
}